

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_init_do(Curl_easy *data,connectdata *conn)

{
  curltime cVar1;
  undefined4 uStack_34;
  CURLcode result;
  SingleRequest *k;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  data_local._4_4_ = Curl_preconnect(data);
  if (data_local._4_4_ == CURLE_OK) {
    if (((conn != (connectdata *)0x0) &&
        (conn->bits = (ConnectBits)((uint)conn->bits & 0xffffdfff),
        (*(uint *)&(data->state).field_0x74c >> 6 & 1) != 0)) &&
       ((conn->handler->flags & 0x1000) == 0)) {
      *(uint *)&(data->state).field_0x74c = *(uint *)&(data->state).field_0x74c & 0xffffffbf;
    }
    *(uint *)&(data->state).field_0x74c = *(uint *)&(data->state).field_0x74c & 0xfffff7ff;
    *(uint *)&(data->state).field_0x74c = *(uint *)&(data->state).field_0x74c & 0xffffff7f;
    if ((*(ushort *)&(data->req).field_0xbb >> 0xc & 1) != 0) {
      (data->state).httpreq = '\x05';
    }
    cVar1 = Curl_now();
    (data->req).start.tv_sec = cVar1.tv_sec;
    *(ulong *)&(data->req).start.tv_usec = CONCAT44(uStack_34,cVar1.tv_usec);
    *(ushort *)&(data->req).field_0xbb = *(ushort *)&(data->req).field_0xbb & 0xfffe | 1;
    (data->req).bytecount = 0;
    *(ushort *)&(data->req).field_0xbb = *(ushort *)&(data->req).field_0xbb & 0xffdf;
    Curl_client_cleanup(data);
    Curl_speedinit(data);
    Curl_pgrsSetUploadCounter(data,0);
    Curl_pgrsSetDownloadCounter(data,0);
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_init_do(struct Curl_easy *data, struct connectdata *conn)
{
  struct SingleRequest *k = &data->req;

  /* if this is a pushed stream, we need this: */
  CURLcode result = Curl_preconnect(data);
  if(result)
    return result;

  if(conn) {
    conn->bits.do_more = FALSE; /* by default there's no curl_do_more() to
                                   use */
    /* if the protocol used doesn't support wildcards, switch it off */
    if(data->state.wildcardmatch &&
       !(conn->handler->flags & PROTOPT_WILDCARD))
      data->state.wildcardmatch = FALSE;
  }

  data->state.done = FALSE; /* *_done() is not called yet */
  data->state.expect100header = FALSE;

  if(data->req.no_body)
    /* in HTTP lingo, no body means using the HEAD request... */
    data->state.httpreq = HTTPREQ_HEAD;

  k->start = Curl_now(); /* start time */
  k->header = TRUE; /* assume header */
  k->bytecount = 0;
  k->ignorebody = FALSE;

  Curl_client_cleanup(data);
  Curl_speedinit(data);
  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);

  return CURLE_OK;
}